

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int get_projected_kf_boost(AV1_COMP *cpi)

{
  long *in_RDI;
  double dVar1;
  double dVar2;
  int projected_kf_boost;
  double tpl_factor_num_stats;
  double tpl_factor;
  int frame_count;
  undefined4 local_4;
  
  if (*(int *)(*in_RDI + 0xac94) < *(int *)((long)in_RDI + 0x6079c)) {
    frame_count = (int)((ulong)in_RDI >> 0x20);
    dVar1 = av1_get_kf_boost_projection_factor(frame_count);
    dVar2 = av1_get_kf_boost_projection_factor(frame_count);
    dVar1 = rint((dVar1 * (double)*(int *)(*in_RDI + 0x8b38)) / dVar2);
    local_4 = (int)dVar1;
  }
  else {
    local_4 = *(int *)(*in_RDI + 0x8b38);
  }
  return local_4;
}

Assistant:

static int get_projected_kf_boost(AV1_COMP *cpi) {
  /*
   * If num_stats_used_for_kf_boost >= frames_to_key, then
   * all stats needed for prior boost calculation are available.
   * Hence projecting the prior boost is not needed in this cases.
   */
  if (cpi->ppi->p_rc.num_stats_used_for_kf_boost >= cpi->rc.frames_to_key)
    return cpi->ppi->p_rc.kf_boost;

  // Get the current tpl factor (number of frames = frames_to_key).
  double tpl_factor = av1_get_kf_boost_projection_factor(cpi->rc.frames_to_key);
  // Get the tpl factor when number of frames = num_stats_used_for_kf_boost.
  double tpl_factor_num_stats = av1_get_kf_boost_projection_factor(
      cpi->ppi->p_rc.num_stats_used_for_kf_boost);
  int projected_kf_boost =
      (int)rint((tpl_factor * cpi->ppi->p_rc.kf_boost) / tpl_factor_num_stats);
  return projected_kf_boost;
}